

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int64 intConst,Instr *instr,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  ValueNumber VVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  Value **ppVVar6;
  ValueInfo *pVVar7;
  Value *pVVar8;
  Instr *local_58;
  int64 symStoreIntConstantValue;
  Value *symStoreValue;
  Sym *symStore;
  Value *local_38;
  Value *cachedValue;
  Value *value;
  Opnd *opnd_local;
  Instr *instr_local;
  int64 intConst_local;
  GlobOpt *this_local;
  
  value = (Value *)opnd;
  opnd_local = (Opnd *)instr;
  instr_local = (Instr *)intConst;
  intConst_local = (int64)this;
  this_00 = Func::GetJITFunctionBody(instr->m_func);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x10a6,"(instr->m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "instr->m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  cachedValue = (Value *)0x0;
  symStore = (Sym *)0x0;
  ppVVar6 = JsUtil::
            BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Lookup(this->int64ConstantToValueMap,(long *)&instr_local,(Value **)&symStore);
  local_38 = *ppVVar6;
  if (local_38 != (Value *)0x0) {
    pVVar7 = ::Value::GetValueInfo(local_38);
    symStoreValue = (Value *)ValueInfo::GetSymStore(pVVar7);
    if ((((Sym *)symStoreValue != (Sym *)0x0) &&
        (bVar2 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,(Sym *)symStoreValue),
        bVar2)) &&
       (symStoreIntConstantValue =
             (int64)GlobOptBlockData::FindValue
                              (&this->currentBlock->globOptData,(Sym *)symStoreValue),
       (Value *)symStoreIntConstantValue != (Value *)0x0)) {
      VVar3 = ::Value::GetValueNumber((Value *)symStoreIntConstantValue);
      VVar4 = ::Value::GetValueNumber(local_38);
      if (VVar3 == VVar4) {
        pVVar7 = ::Value::GetValueInfo((Value *)symStoreIntConstantValue);
        bVar2 = ValueInfo::TryGetInt64ConstantValue(pVVar7,(int64 *)&local_58,false);
        if ((bVar2) && (local_58 == instr_local)) {
          cachedValue = (Value *)symStoreIntConstantValue;
        }
      }
    }
  }
  if (cachedValue == (Value *)0x0) {
    cachedValue = NewInt64ConstantValue(this,(int64)instr_local,(Instr *)opnd_local);
  }
  pVVar8 = GlobOptBlockData::InsertNewValue
                     (&this->currentBlock->globOptData,cachedValue,(Opnd *)value);
  return pVVar8;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int64 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Assert(instr->m_func->GetJITFunctionBody()->IsWasmFunction());

    Value *value = nullptr;
    Value *const cachedValue = this->int64ConstantToValueMap->Lookup(intConst, nullptr);

    if (cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && this->currentBlock->globOptData.IsLive(symStore))
        {

            Value *const symStoreValue = this->currentBlock->globOptData.FindValue(symStore);
            int64 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetInt64ConstantValue(&symStoreIntConstantValue, false) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewInt64ConstantValue(intConst, instr);
    }

    return this->currentBlock->globOptData.InsertNewValue(value, opnd);
}